

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void Cmd_acsprofile(FCommandLine *argv,APlayerPawn *who,int key)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t __n;
  size_t sVar6;
  code *sorter;
  long lVar7;
  BYTE *pBVar8;
  TArray<ProfileCollector,_ProfileCollector> FuncProfiles;
  TArray<ProfileCollector,_ProfileCollector> ScriptProfiles;
  char *endptr;
  TArray<ProfileCollector,_ProfileCollector> local_68;
  TArray<ProfileCollector,_ProfileCollector> local_58;
  long local_40;
  char *local_38;
  
  local_58.Array = (ProfileCollector *)0x0;
  local_58.Most = 0;
  local_58.Count = 0;
  local_68.Array = (ProfileCollector *)0x0;
  local_68.Most = 0;
  local_68.Count = 0;
  ArrangeScriptProfiles(&local_58);
  ArrangeFunctionProfiles(&local_68);
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 < 2) {
    sorter = sort_by_total_instr;
    lVar7 = 10;
LAB_003c3e4a:
    ShowProfileData(&local_58,lVar7,sorter,false);
    ShowProfileData(&local_68,lVar7,sorter,true);
  }
  else {
    pcVar4 = FCommandLine::operator[](argv,1);
    iVar2 = strcasecmp(pcVar4,"clear");
    if (iVar2 != 0) {
      iVar2 = 1;
      sorter = sort_by_total_instr;
      lVar7 = 10;
LAB_003c3d74:
      iVar3 = FCommandLine::argc(argv);
      if (iVar2 < iVar3) {
        local_40 = lVar7;
        pcVar4 = FCommandLine::operator[](argv,iVar2);
        lVar7 = strtol(pcVar4,&local_38,0);
        pcVar4 = local_38;
        pcVar5 = FCommandLine::operator[](argv,iVar2);
        if (pcVar4 == pcVar5) {
          pcVar4 = FCommandLine::operator[](argv,iVar2);
          __n = strlen(pcVar4);
          pBVar8 = "\x01\x02\x02\x01\x01";
          lVar7 = 0;
          do {
            if (*pBVar8 <= __n) {
              pcVar4 = *(char **)((long)Cmd_acsprofile::sort_names + lVar7);
              sVar6 = strlen(pcVar4);
              if (__n <= sVar6) {
                pcVar5 = FCommandLine::operator[](argv,iVar2);
                iVar3 = strncasecmp(pcVar5,pcVar4,__n);
                if (iVar3 == 0) goto LAB_003c3e28;
              }
            }
            lVar7 = lVar7 + 8;
            pBVar8 = pBVar8 + 1;
            if (lVar7 == 0x28) {
              pcVar4 = FCommandLine::operator[](argv,iVar2);
              Printf("Unknown option \'%s\'\n",pcVar4);
              Printf("acsprofile clear : Reset profiling information\n");
              Printf("acsprofile [total|min|max|avg|runs] [<limit>]\n");
              goto LAB_003c3f24;
            }
          } while( true );
        }
        goto LAB_003c3db9;
      }
      goto LAB_003c3e4a;
    }
    if ((ulong)local_58._8_8_ >> 0x20 != 0) {
      lVar7 = 0;
      do {
        puVar1 = *(undefined8 **)((long)&(local_58.Array)->ProfileData + lVar7);
        *puVar1 = 0;
        puVar1[1] = 0xffffffff00000000;
        *(undefined4 *)(puVar1 + 2) = 0;
        lVar7 = lVar7 + 0x18;
      } while (((ulong)local_58._8_8_ >> 0x20) * 0x18 != lVar7);
    }
    if ((ulong)local_68._8_8_ >> 0x20 != 0) {
      lVar7 = 0;
      do {
        puVar1 = *(undefined8 **)((long)&(local_68.Array)->ProfileData + lVar7);
        *puVar1 = 0;
        puVar1[1] = 0xffffffff00000000;
        *(undefined4 *)(puVar1 + 2) = 0;
        lVar7 = lVar7 + 0x18;
      } while (((ulong)local_68._8_8_ >> 0x20) * 0x18 != lVar7);
    }
  }
LAB_003c3f24:
  TArray<ProfileCollector,_ProfileCollector>::~TArray(&local_68);
  TArray<ProfileCollector,_ProfileCollector>::~TArray(&local_58);
  return;
LAB_003c3e28:
  sorter = *(code **)((long)Cmd_acsprofile::sort_funcs + lVar7);
  lVar7 = local_40;
LAB_003c3db9:
  iVar2 = iVar2 + 1;
  goto LAB_003c3d74;
}

Assistant:

CCMD(acsprofile)
{
	static int (*sort_funcs[])(const void*, const void *) =
	{
		sort_by_total_instr,
		sort_by_min,
		sort_by_max,
		sort_by_avg,
		sort_by_runs
	};
	static const char *sort_names[] = { "total", "min", "max", "avg", "runs" };
	static const BYTE sort_match_len[] = {   1,     2,     2,     1,      1 };

	TArray<ProfileCollector> ScriptProfiles, FuncProfiles;
	long limit = 10;
	int (*sorter)(const void *, const void *) = sort_by_total_instr;

	assert(countof(sort_names) == countof(sort_match_len));

	ArrangeScriptProfiles(ScriptProfiles);
	ArrangeFunctionProfiles(FuncProfiles);

	if (argv.argc() > 1)
	{
		// `acsprofile clear` will zero all profiling information collected so far.
		if (stricmp(argv[1], "clear") == 0)
		{
			ClearProfiles(ScriptProfiles);
			ClearProfiles(FuncProfiles);
			return;
		}
		for (int i = 1; i < argv.argc(); ++i)
		{
			// If it's a number, set the display limit.
			char *endptr;
			long num = strtol(argv[i], &endptr, 0);
			if (endptr != argv[i])
			{
				limit = num;
				continue;
			}
			// If it's a name, set the sort method. We accept partial matches for
			// options that are shorter than the sort name.
			size_t optlen = strlen(argv[i]);
			unsigned int j;
			for (j = 0; j < countof(sort_names); ++j)
			{
				if (optlen < sort_match_len[j] || optlen > strlen(sort_names[j]))
				{ // Too short or long to match.
					continue;
				}
				if (strnicmp(argv[i], sort_names[j], optlen) == 0)
				{
					sorter = sort_funcs[j];
					break;
				}
			}
			if (j == countof(sort_names))
			{
				Printf("Unknown option '%s'\n", argv[i]);
				Printf("acsprofile clear : Reset profiling information\n");
				Printf("acsprofile [total|min|max|avg|runs] [<limit>]\n");
				return;
			}
		}
	}

	ShowProfileData(ScriptProfiles, limit, sorter, false);
	ShowProfileData(FuncProfiles, limit, sorter, true);
}